

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_BnB_Node.cpp
# Opt level: O2

string * __thiscall
BGIP_BnB_Node::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,BGIP_BnB_Node *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"BGIP_BnB_Node[");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  poVar1 = std::operator<<(poVar1,"] depth(=nr. spec. jtypes)= ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," F ");
  poVar1 = std::ostream::_M_insert<double>(this->_m_g + this->_m_h);
  std::operator<<(poVar1," G ");
  poVar1 = std::ostream::_M_insert<double>(this->_m_g);
  std::operator<<(poVar1," H ");
  poVar1 = std::ostream::_M_insert<double>(this->_m_h);
  std::operator<<(poVar1," nrAleft ");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

string BGIP_BnB_Node::SoftPrint() const 
{
    std::stringstream ss;
    ss << "BGIP_BnB_Node[" << this << "] depth(=nr. spec. jtypes)= " << _m_depth
       << " F " << GetF()
       << " G "
       << _m_g
       << " H "
       << _m_h
       << " nrAleft "
       //<< _m_nrActionsLeftToSpecify
       ;
#if INCR_EXPAND
    ss << " jaExp <";
    for(Index ja=0;ja!=_m_alreadyExpandedJA.size();++ja)
        if(_m_alreadyExpandedJA[ja])
            ss << ja << " ";
    ss << ">";
#endif
    return(ss.str());
}